

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall djb::tab::extract_ndf(tab *this,brdf *brdf)

{
  vector<float,_std::allocator<float>_> *this_00;
  ulong __n;
  int iVar1;
  ulong uVar2;
  iterator iVar3;
  pointer pvVar4;
  float *__dest;
  int j2;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  vector<double,_std::allocator<double>_> v;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> frp_v;
  vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_> io;
  matrix km;
  int local_114;
  undefined1 local_108 [12];
  float fStack_fc;
  undefined8 local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  tab *local_d8;
  float local_cc;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_c8;
  ulong local_b0;
  void *local_a8;
  iterator iStack_a0;
  pair<djb::vec3,_djb::vec3> *local_98;
  double local_90;
  double local_88;
  long local_80;
  ulong local_78;
  double local_70;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_68;
  matrix local_50;
  
  local_f0 = (long)this->m_zres;
  uVar11 = local_f0 - 1;
  iVar1 = this->m_pres;
  lVar12 = (long)iVar1;
  iVar7 = (int)uVar11;
  iVar9 = iVar7 * iVar1;
  iVar5 = 0;
  local_108._0_8_ = (pointer)0x0;
  local_d8 = this;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50.mij,(ulong)(uint)(iVar9 * iVar9),(value_type_conflict2 *)local_108,
             (allocator_type *)&local_a8);
  local_98 = (pair<djb::vec3,_djb::vec3> *)0x0;
  local_a8 = (void *)0x0;
  iStack_a0._M_current = (pair<djb::vec3,_djb::vec3> *)0x0;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fVar15 = (float)iVar7;
  local_50.size = iVar9;
  if (0 < lVar12) {
    do {
      if (1 < (int)local_f0) {
        fVar16 = ((float)iVar5 / (float)iVar1 + (float)iVar5 / (float)iVar1) * 3.1415927;
        iVar9 = 0;
        do {
          fVar17 = ((float)iVar9 / fVar15) * ((float)iVar9 / fVar15) * 3.1415927 * 0.5;
          fVar18 = cosf(fVar17);
          fVar17 = sinf(fVar17);
          fVar19 = cosf(fVar16);
          fVar19 = fVar19 * fVar17;
          local_108._4_4_ = sinf(fVar16);
          local_108._4_4_ = (float)local_108._4_4_ * fVar17;
          local_108._0_4_ = fVar19;
          stack0xffffffffffffff00 = (pointer)CONCAT44(fVar19,fVar18);
          local_f8 = (pointer)CONCAT44(fVar18,local_108._4_4_);
          if (iStack_a0._M_current == local_98) {
            std::
            vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>::
            _M_realloc_insert<std::pair<djb::vec3,djb::vec3>>
                      ((vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>
                        *)&local_a8,iStack_a0,(pair<djb::vec3,_djb::vec3> *)local_108);
          }
          else {
            *(pointer *)&((iStack_a0._M_current)->second).y = local_f8;
            ((iStack_a0._M_current)->first).x = fVar19;
            ((iStack_a0._M_current)->first).y = (float_t)local_108._4_4_;
            *(pointer *)&((iStack_a0._M_current)->first).z = stack0xffffffffffffff00;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          iVar9 = iVar9 + 1;
        } while (iVar7 != iVar9);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar1);
  }
  (*brdf->_vptr_brdf[3])(&local_68,brdf,&local_a8,0);
  local_f8 = local_c8.
             super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  unique0x1000089f =
       local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_108._0_8_ =
       local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_c8.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0.0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_108);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_68);
  local_b0 = uVar11 & 0xffffffff;
  if (0 < iVar1) {
    local_88 = 3.1415927410125732 / (double)iVar7;
    local_90 = 6.2831854820251465 / (double)iVar1;
    local_e0 = 0;
    local_e8 = 0;
    do {
      if (1 < (int)local_f0) {
        fVar16 = (float)(int)local_e8 / (float)iVar1;
        fVar16 = (fVar16 + fVar16) * 3.1415927;
        local_80 = local_e8 * uVar11;
        local_114 = (int)local_e0;
        uVar6 = 0;
        do {
          fVar17 = (float)(int)uVar6 / fVar15;
          fVar17 = fVar17 * fVar17 * 3.1415927 * 0.5;
          local_cc = cosf(fVar17);
          fVar17 = sinf(fVar17);
          fVar18 = cosf(fVar16);
          fVar19 = sinf(fVar16);
          pvVar4 = local_c8.
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar13 = uVar6 + local_80;
          uVar2 = local_c8.
                  super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13]._M_size;
          __n = uVar2 * 4;
          local_78 = uVar6;
          __dest = (float *)operator_new(__n);
          if (pvVar4[lVar13]._M_data != (float *)0x0) {
            memcpy(__dest,pvVar4[lVar13]._M_data,__n);
          }
          fVar23 = *__dest;
          if (uVar2 != 1) {
            lVar13 = 4;
            do {
              fVar23 = fVar23 + *(float *)((long)__dest + lVar13);
              lVar13 = lVar13 + 4;
            } while (__n - lVar13 != 0);
          }
          local_70 = (double)(fVar23 / (float)uVar2) * local_88 * local_90;
          lVar13 = 0;
          iVar5 = 0;
          do {
            fVar23 = (float)iVar5 / (float)iVar1;
            fVar23 = (fVar23 + fVar23) * 3.1415927;
            lVar10 = 0;
            do {
              fVar24 = (float)(int)lVar10 / fVar15;
              fVar25 = fVar24 * fVar24 * 3.1415927 * 0.5;
              fVar20 = cosf(fVar25);
              fVar25 = sinf(fVar25);
              fVar21 = cosf(fVar23);
              fVar22 = sinf(fVar23);
              fVar21 = fVar20 * local_cc +
                       fVar22 * fVar25 * fVar19 * fVar17 + fVar21 * fVar25 * fVar18 * fVar17;
              fVar20 = 0.0;
              if (0.0 <= fVar21) {
                fVar20 = fVar21;
              }
              fVar21 = 1.0;
              if (fVar20 <= 1.0) {
                fVar21 = fVar20;
              }
              local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)local_50.size * (long)local_114 + lVar13 + lVar10] =
                   (double)(fVar21 * fVar24 * fVar25) * local_70;
              lVar10 = lVar10 + 1;
            } while (iVar7 != (int)lVar10);
            iVar5 = iVar5 + 1;
            lVar13 = lVar13 + uVar11;
          } while (iVar5 != iVar1);
          operator_delete(__dest);
          uVar6 = local_78 + 1;
          local_114 = local_114 + 1;
        } while (uVar6 != local_b0);
      }
      local_e8 = local_e8 + 1;
      local_e0 = (ulong)(uint)((int)local_e0 + iVar7);
    } while (local_e8 != lVar12);
  }
  matrix::eigenvector((vector<double,_std::allocator<double>_> *)local_108,&local_50,4);
  if (0 < iVar1) {
    this_00 = &local_d8->m_ndf;
    lVar13 = local_f0 * 8;
    lVar14 = 0;
    lVar10 = 0;
    do {
      lVar8 = lVar14;
      uVar11 = local_b0;
      if (1 < (int)local_f0) {
        do {
          local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ =
               (float)*(double *)((long)(size_t *)local_108._0_8_ + lVar8);
          iVar3._M_current =
               (local_d8->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (local_d8->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this_00,iVar3,(float *)&local_68);
          }
          else {
            *iVar3._M_current =
                 local_68.
                 super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start._0_4_;
            (local_d8->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          lVar8 = lVar8 + 8;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      lVar10 = lVar10 + 1;
      lVar8 = (long)(iVar7 * (int)lVar10);
      fVar15 = (float)*(double *)(local_108._0_8_ + lVar8 * 8 + -8);
      fVar15 = (fVar15 + fVar15) -
               (float)(double)(&((pointer)(local_108._0_8_ + -0x10))->_M_size)[lVar8];
      local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0.0;
      if (0.0 <= fVar15) {
        local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = fVar15;
      }
      iVar3._M_current =
           (local_d8->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (local_d8->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (this_00,iVar3,(float *)&local_68);
      }
      else {
        *iVar3._M_current =
             local_68.
             super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start._0_4_;
        (local_d8->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      lVar14 = lVar14 + lVar13 + -8;
    } while (lVar10 != lVar12);
  }
  fwrite("djb_verbose: NDF extraction complete\n",0x25,1,_stdout);
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_);
  }
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&local_c8);
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8);
  }
  if (local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void tab::extract_ndf(const brdf &brdf)
{
	const int w = m_zres - 1;
	const int h = m_pres;
	const double du1 = (double)m_pi() / w;
	const double du2 = 2 * (double)m_pi() / h;
	matrix km(w * h);
	std::vector<brdf::io_pair> io;
	std::vector<brdf::value_type> frp_v;

	// evaluate all directions
	for (int i2 = 0; i2 < h; ++i2)
	for (int i1 = 0; i1 < w; ++i1) {
		float_t u1 = (float_t)i1 / w; // in [0, 1)
		float_t u2 = (float_t)i2 / h; // in [0, 1)
		float_t ti = sqr(u1) * m_pi() / 2; // in [0, pi/2)
		float_t pi = u2 * 2 * m_pi(); // in [0, 2pi)
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i * cos(pi), z_i * sin(pi), zi);

		io.push_back(brdf::io_pair(wi, wi));
	}
	frp_v = brdf.eval_batch(io);

	// build kernel
	for (int i2 = 0; i2 < h; ++i2)
	for (int i1 = 0; i1 < w; ++i1) {
		float_t u1_i = (float_t)i1 / w; // in [0, 1)
		float_t u2_i = (float_t)i2 / h; // in [0, 1)
		float_t ti = sqr(u1_i) * m_pi() / 2; // in [0, pi/2)
		float_t pi = u2_i * 2 * m_pi(); // in [0, 2pi)
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i * cos(pi), z_i * sin(pi), zi);
		brdf::value_type frp = frp_v[i1 + w * i2];
		float_t frp_i = frp.sum() / frp.size();//dot(frp, vec3(0.2126, 0.7152, 0.0722));
		double kji_tmp = (double)frp_i * du1 * du2;

		for (int j2 = 0; j2 < h; ++j2)
		for (int j1 = 0; j1 < w; ++j1) {
			float_t u1_m = (float_t)j1 / w; // in [0, 1)
			float_t u2_m = (float_t)j2 / h; // in [0, 1)
			float_t tm = sqr(u1_m) * m_pi() / 2; // in [0, pi/2)
			float_t pm = u2_m * 2 * m_pi();      // in [0, 2pi)
			float_t zm = cos(tm), z_m = sin(tm);
			vec3 wm = vec3(z_m * cos(pm), z_m * sin(pm), zm);
			float_t dp = sat(dot(wm, wi));

			km(j1 + w * j2, i1 + w * i2) = kji_tmp * (double)(u1_m * dp * z_m);
		}
	}

	// compute slope pdf
	const std::vector<double> v = km.eigenvector(4);

	// store NDF
	for (int j = 0; j < h; ++j) {
		for (int i = 0; i < w; ++i) {
			m_ndf.push_back(v[i + w * j]);
		}
		float_t p1 = v[j * w + w - 2];
		float_t p2 = v[j * w + w - 1];
		m_ndf.push_back(max((float_t)0, 2 * p2 - p1));
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF extraction complete\n");
#endif
}